

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.cpp
# Opt level: O2

void __thiscall NetworkService::poll_frontend(NetworkService *this)

{
  WorkerContext *pWVar1;
  mapped_type *pmVar2;
  socket_t *psVar3;
  string_view trace;
  string_view trace_00;
  string_view trace_01;
  string_view trace_02;
  string_view trace_03;
  string_view trace_04;
  string_view trace_05;
  string_view trace_06;
  string worker_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> client_addr;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  locks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> request;
  Task task;
  DatabaseSnapshot snapshot;
  
  psVar3 = &this->frontend;
  trace._M_str = 
  "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,144)"
  ;
  trace._M_len = 0x68;
  s_recv<std::__cxx11::string>(&client_addr,psVar3,trace);
  trace_04._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,146)"
  ;
  trace_04._M_len = 0x68;
  s_recv_padding(psVar3,trace_04);
  trace_00._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,148)"
  ;
  trace_00._M_len = 0x68;
  s_recv<std::__cxx11::string>(&request,psVar3,trace_00);
  locks.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  locks.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  locks.
  super__Vector_base<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Database::snapshot(&snapshot,this->db);
  parse_command((Command *)&task,&request);
  dispatch_locks((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                  *)&worker_addr,(Command *)&task,&snapshot);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::_M_move_assign(&locks,&worker_addr);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
             *)&worker_addr);
  std::__detail::__variant::
  _Variant_storage<false,_SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  ::~_Variant_storage((_Variant_storage<false,_SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                       *)&task);
  task.spec_ = Database::allocate_task(this->db,&request,&client_addr,&locks);
  task.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  task.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  task.changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&worker_addr,
             (string *)
             (this->worker_queue).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_front(&(this->worker_queue).c);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>_>_>_>
           ::at(&this->wctxs,&worker_addr);
  pWVar1 = (pmVar2->_M_t).super___uniq_ptr_impl<WorkerContext,_std::default_delete<WorkerContext>_>.
           _M_t.super__Tuple_impl<0UL,_WorkerContext_*,_std::default_delete<WorkerContext>_>.
           super__Head_base<0UL,_WorkerContext_*,_false>._M_head_impl;
  std::optional<Task>::operator=(&pWVar1->task,&task);
  DatabaseSnapshot::operator=(&pWVar1->snap,&snapshot);
  psVar3 = &this->backend;
  trace_01._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,184)"
  ;
  trace_01._M_len = 0x68;
  s_send<std::__cxx11::string>(psVar3,&worker_addr,trace_01,2);
  trace_05._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,185)"
  ;
  trace_05._M_len = 0x68;
  s_send_padding(psVar3,trace_05,2);
  trace_02._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,186)"
  ;
  trace_02._M_len = 0x68;
  s_send<std::__cxx11::string>(psVar3,&client_addr,trace_02,2);
  trace_06._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,187)"
  ;
  trace_06._M_len = 0x68;
  s_send_padding(psVar3,trace_06,2);
  trace_03._M_str =
       "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,188)"
  ;
  trace_03._M_len = 0x68;
  s_send<std::__cxx11::string>(psVar3,&request,trace_03,0);
  std::__cxx11::string::~string((string *)&worker_addr);
  std::vector<DBChange,_std::allocator<DBChange>_>::~vector(&task.changes_);
  DatabaseSnapshot::~DatabaseSnapshot(&snapshot);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector(&locks);
  std::__cxx11::string::~string((string *)&request);
  std::__cxx11::string::~string((string *)&client_addr);
  return;
}

Assistant:

void NetworkService::poll_frontend() {
    //  Now get next client request, route to LRU worker
    //  Client request is [address][empty][request]
    auto client_addr{s_recv<std::string>(&frontend, ZMQTRACE)};

    s_recv_padding(&frontend, ZMQTRACE);

    auto request{s_recv<std::string>(&frontend, ZMQTRACE)};

    std::vector<DatabaseLock> locks;
    DatabaseSnapshot snapshot = db.snapshot();

    try {
        Command cmd{parse_command(request)};
        locks = std::move(dispatch_locks(cmd, &snapshot));
    } catch (const std::runtime_error &err) {
        s_send(&frontend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&frontend, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&frontend, Response::error("Parse error").to_string(), ZMQTRACE);
        return;
    }

    TaskSpec *spec = nullptr;
    try {
        spec = db.allocate_task(request, client_addr, locks);
    } catch (const std::runtime_error &err) {
        s_send(&frontend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&frontend, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&frontend,
               Response::error("Can't acquire lock, try again later", true)
                   .to_string(),
               ZMQTRACE);
        return;
    }

    Task task{Task(spec)};

    std::string worker_addr = worker_queue.front();
    worker_queue.pop();
    WorkerContext *wctx = wctxs.at(worker_addr).get();
    wctx->task = std::move(task);
    wctx->snap = std::move(snapshot);

    s_send(&backend, worker_addr, ZMQTRACE, ZMQ_SNDMORE);
    s_send_padding(&backend, ZMQTRACE, ZMQ_SNDMORE);
    s_send(&backend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
    s_send_padding(&backend, ZMQTRACE, ZMQ_SNDMORE);
    s_send(&backend, request, ZMQTRACE);
}